

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_CloneBlockScope
              (BlockActivationObject *blockScope,ScriptContext *scriptContext)

{
  ThreadContext *threadContext;
  BlockActivationObject *pBVar1;
  undefined1 local_38 [8];
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  BlockActivationObject *blockScope_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_38,threadContext);
  pBVar1 = BlockActivationObject::Clone(blockScope,(ScriptContext *)reentrancylock._24_8_);
  JsReentLock::~JsReentLock((JsReentLock *)local_38);
  return pBVar1;
}

Assistant:

Var JavascriptOperators::OP_CloneBlockScope(BlockActivationObject *blockScope, ScriptContext *scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_CloneBlockScope, reentrancylock, scriptContext->GetThreadContext());
        return blockScope->Clone(scriptContext);
        JIT_HELPER_END(OP_CloneBlockScope);
    }